

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTypePtr
xmlSchemaAddType(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,
                xmlChar *name,xmlChar *nsName,xmlNodePtr node,int topLevel)

{
  int iVar1;
  xmlSchemaTypePtr __s;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlSchemaItemListPtr *list;
  
  if (schema == (xmlSchemaPtr)0x0 || ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    return (xmlSchemaTypePtr)0x0;
  }
  __s = (xmlSchemaTypePtr)(*xmlMalloc)(0xe0);
  if (__s == (xmlSchemaTypePtr)0x0) {
    xmlSchemaPErrMemory(ctxt);
    return (xmlSchemaTypePtr)0x0;
  }
  memset(__s,0,0xe0);
  __s->type = type;
  __s->name = name;
  __s->targetNamespace = nsName;
  __s->node = node;
  if (topLevel == 0) {
    list = &ctxt->constructor->bucket->locals;
    iVar1 = 10;
  }
  else {
    if (ctxt->isRedefine != 0) {
      pxVar2 = xmlSchemaAddRedef(ctxt,ctxt->redefined,__s,name,nsName);
      ctxt->redef = pxVar2;
      if (pxVar2 == (xmlSchemaRedefPtr_conflict)0x0) goto LAB_0018f79c;
      ctxt->redefCounter = 0;
    }
    list = &ctxt->constructor->bucket->globals;
    iVar1 = 5;
  }
  iVar1 = xmlSchemaAddItemSize(list,iVar1,__s);
  if (-1 < iVar1) {
    iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,__s);
    if (iVar1 < 0) {
      xmlSchemaPErrMemory(ctxt);
      return __s;
    }
    return __s;
  }
  xmlSchemaPErrMemory(ctxt);
LAB_0018f79c:
  (*xmlFree)(__s);
  return (xmlSchemaTypePtr)0x0;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaAddType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
		 xmlSchemaTypeType type,
                 const xmlChar * name, const xmlChar * nsName,
		 xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->type = type;
    ret->name = name;
    ret->targetNamespace = nsName;
    ret->node = node;
    if (topLevel) {
	if (ctxt->isRedefine) {
	    ctxt->redef = xmlSchemaAddRedef(ctxt, ctxt->redefined,
		ret, name, nsName);
	    if (ctxt->redef == NULL) {
		xmlFree(ret);
		return(NULL);
	    }
	    ctxt->redefCounter = 0;
	}
	WXS_ADD_GLOBAL(ctxt, ret);
    } else
	WXS_ADD_LOCAL(ctxt, ret);
    WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}